

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O0

block * __thiscall net_uv::Buffer::createBlock(Buffer *this)

{
  block *pbVar1;
  char *pcVar2;
  block *p;
  Buffer *this_local;
  
  pbVar1 = (block *)malloc(0x20);
  pbVar1->next = (block *)0x0;
  pbVar1->pre = (block *)0x0;
  pbVar1->dataLen = 0;
  pcVar2 = (char *)malloc((ulong)this->m_blockSize);
  pbVar1->data = pcVar2;
  return pbVar1;
}

Assistant:

block* createBlock()
	{
		auto p = (block*)fc_malloc(sizeof(block));
		p->next = NULL;
		p->pre = NULL;
		p->dataLen = 0;
		p->data = (char*)fc_malloc(m_blockSize);
		return p;
	}